

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::StringTrieBuilder::writeNode
          (StringTrieBuilder *this,int32_t start,int32_t limit,int32_t unitIndex)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int32_t length_1;
  int32_t maxLinearMatchLength;
  int32_t length;
  int32_t lastUnitIndex;
  int32_t maxUnit;
  int32_t minUnit;
  int32_t type;
  int32_t value;
  UBool hasValue;
  int32_t unitIndex_local;
  int32_t limit_local;
  int32_t start_local;
  StringTrieBuilder *this_local;
  
  type._3_1_ = '\0';
  minUnit = 0;
  iVar1 = (*(this->super_UObject)._vptr_UObject[3])(this,(ulong)(uint)start);
  unitIndex_local = start;
  if (unitIndex == iVar1) {
    unitIndex_local = start + 1;
    minUnit = (*(this->super_UObject)._vptr_UObject[5])();
    if (unitIndex_local == limit) {
      iVar1 = (*(this->super_UObject)._vptr_UObject[0x11])(this,(ulong)(uint)minUnit,1);
      return iVar1;
    }
    type._3_1_ = '\x01';
  }
  uVar2 = (*(this->super_UObject)._vptr_UObject[4])
                    (this,(ulong)(uint)unitIndex_local,(ulong)(uint)unitIndex);
  uVar3 = (*(this->super_UObject)._vptr_UObject[4])(this,(ulong)(limit - 1),(ulong)(uint)unitIndex);
  if ((uVar2 & 0xffff) == (uVar3 & 0xffff)) {
    maxLinearMatchLength =
         (*(this->super_UObject)._vptr_UObject[6])
                   (this,(ulong)(uint)unitIndex_local,(ulong)(limit - 1),(ulong)(uint)unitIndex);
    writeNode(this,unitIndex_local,limit,maxLinearMatchLength);
    length_1 = maxLinearMatchLength - unitIndex;
    uVar2 = (*(this->super_UObject)._vptr_UObject[0xd])();
    while ((int)uVar2 < length_1) {
      maxLinearMatchLength = maxLinearMatchLength - uVar2;
      length_1 = length_1 - uVar2;
      (*(this->super_UObject)._vptr_UObject[0x10])
                (this,(ulong)(uint)unitIndex_local,(ulong)(uint)maxLinearMatchLength,(ulong)uVar2);
      iVar1 = (*(this->super_UObject)._vptr_UObject[0xc])();
      (*(this->super_UObject)._vptr_UObject[0xf])(this,(ulong)((iVar1 + uVar2) - 1));
    }
    (*(this->super_UObject)._vptr_UObject[0x10])
              (this,(ulong)(uint)unitIndex_local,(ulong)(uint)unitIndex,(ulong)(uint)length_1);
    iVar1 = (*(this->super_UObject)._vptr_UObject[0xc])();
    maxUnit = iVar1 + length_1 + -1;
  }
  else {
    iVar1 = (*(this->super_UObject)._vptr_UObject[7])
                      (this,(ulong)(uint)unitIndex_local,(ulong)(uint)limit,(ulong)(uint)unitIndex);
    writeBranchSubNode(this,unitIndex_local,limit,unitIndex,iVar1);
    maxUnit = iVar1 - 1;
    iVar1 = (*(this->super_UObject)._vptr_UObject[0xc])();
    if (iVar1 <= maxUnit) {
      (*(this->super_UObject)._vptr_UObject[0xf])(this,(ulong)(uint)maxUnit);
      maxUnit = 0;
    }
  }
  iVar1 = (*(this->super_UObject)._vptr_UObject[0x12])
                    (this,(ulong)(uint)(int)type._3_1_,(ulong)(uint)minUnit,(ulong)(uint)maxUnit);
  return iVar1;
}

Assistant:

int32_t
StringTrieBuilder::writeNode(int32_t start, int32_t limit, int32_t unitIndex) {
    UBool hasValue=FALSE;
    int32_t value=0;
    int32_t type;
    if(unitIndex==getElementStringLength(start)) {
        // An intermediate or final value.
        value=getElementValue(start++);
        if(start==limit) {
            return writeValueAndFinal(value, TRUE);  // final-value node
        }
        hasValue=TRUE;
    }
    // Now all [start..limit[ strings are longer than unitIndex.
    int32_t minUnit=getElementUnit(start, unitIndex);
    int32_t maxUnit=getElementUnit(limit-1, unitIndex);
    if(minUnit==maxUnit) {
        // Linear-match node: All strings have the same character at unitIndex.
        int32_t lastUnitIndex=getLimitOfLinearMatch(start, limit-1, unitIndex);
        writeNode(start, limit, lastUnitIndex);
        // Break the linear-match sequence into chunks of at most kMaxLinearMatchLength.
        int32_t length=lastUnitIndex-unitIndex;
        int32_t maxLinearMatchLength=getMaxLinearMatchLength();
        while(length>maxLinearMatchLength) {
            lastUnitIndex-=maxLinearMatchLength;
            length-=maxLinearMatchLength;
            writeElementUnits(start, lastUnitIndex, maxLinearMatchLength);
            write(getMinLinearMatch()+maxLinearMatchLength-1);
        }
        writeElementUnits(start, unitIndex, length);
        type=getMinLinearMatch()+length-1;
    } else {
        // Branch node.
        int32_t length=countElementUnits(start, limit, unitIndex);
        // length>=2 because minUnit!=maxUnit.
        writeBranchSubNode(start, limit, unitIndex, length);
        if(--length<getMinLinearMatch()) {
            type=length;
        } else {
            write(length);
            type=0;
        }
    }
    return writeValueAndType(hasValue, value, type);
}